

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::RegularExpression::matchAnchor
          (RegularExpression *this,Context *context,XMLInt32 ch,XMLSize_t offset)

{
  bool bVar1;
  XMLSize_t offset_local;
  XMLInt32 ch_local;
  Context *context_local;
  RegularExpression *this_local;
  
  if ((ch & 0xffffU) == 0x24) {
    bVar1 = isSet(context->fOptions,8);
    if (bVar1) {
      if ((offset != context->fLimit) &&
         ((context->fLimit <= offset ||
          (bVar1 = RegxUtil::isEOLChar(context->fString[offset]), !bVar1)))) {
        return false;
      }
    }
    else if (((offset != context->fLimit) &&
             ((offset + 1 != context->fLimit ||
              (bVar1 = RegxUtil::isEOLChar(context->fString[offset]), !bVar1)))) &&
            ((offset + 2 != context->fLimit ||
             ((context->fString[offset] != L'\r' || (context->fString[offset + 1] != L'\n')))))) {
      return false;
    }
  }
  else if ((ch & 0xffffU) == 0x5e) {
    bVar1 = isSet(context->fOptions,8);
    if (bVar1) {
      if ((offset != context->fStart) &&
         ((offset <= context->fStart ||
          (bVar1 = RegxUtil::isEOLChar(context->fString[offset - 1]), !bVar1)))) {
        return false;
      }
    }
    else if (offset != context->fStart) {
      return false;
    }
  }
  return true;
}

Assistant:

bool RegularExpression::matchAnchor(Context* const context, const XMLInt32 ch,
                                    const XMLSize_t offset) const
{
    switch ((XMLCh) ch) {
    case chDollarSign:
        if (isSet(context->fOptions, MULTIPLE_LINE)) {
            if (!(offset == context->fLimit || (offset < context->fLimit
                && RegxUtil::isEOLChar(context->fString[offset]))))
                return false;
        }
        else {

            if (!(offset == context->fLimit
                || (offset+1 == context->fLimit
                    && RegxUtil::isEOLChar(context->fString[offset]))
                || (offset+2 == context->fLimit
                    && context->fString[offset] == chCR
                    && context->fString[offset+1] == chLF)))
                return false;
        }
        break;
    case chCaret:
        if (!isSet(context->fOptions, MULTIPLE_LINE)) {

            if (offset != context->fStart)
                return false;
        }
        else {

            if (!(offset == context->fStart || (offset > context->fStart
                && RegxUtil::isEOLChar(context->fString[offset-1]))))
                return false;
        }
        break;
    }

    return true;
}